

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::_::HashSetCallbacks>::
insert<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char_const>&>
          (HashIndex<kj::_::HashSetCallbacks> *this,
          ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> table,size_t pos,
          ArrayPtr<const_unsigned_char> *params)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar6;
  HashBucket *pHVar7;
  HashBucket *s;
  HashBucket *pHVar8;
  HashIndex<kj::_::HashSetCallbacks> *this_00;
  ulong targetSize;
  ArrayPtr<const_unsigned_char> *in_R9;
  size_t sVar9;
  Maybe<unsigned_long> MVar10;
  
  this_00 = (HashIndex<kj::_::HashSetCallbacks> *)table.ptr;
  uVar2 = (this_00->buckets).size_ * 2;
  if (uVar2 < (this_00->erasedCount + pos) * 3 + 3) {
    targetSize = pos * 2 + 2;
    if (targetSize < uVar2) {
      targetSize = uVar2;
    }
    rehash(this_00,targetSize);
  }
  uVar4 = hashCode<kj::ArrayPtr<unsigned_char_const>&>(in_R9);
  uVar5 = _::chooseBucket((uint)(uVar4 != 0),(uint)(this_00->buckets).size_);
  pHVar8 = (HashBucket *)0x0;
  aVar6 = extraout_RDX;
  do {
    pHVar7 = (this_00->buckets).ptr + uVar5;
    uVar1 = pHVar7->value;
    if (uVar1 == 1) {
      if (pHVar8 == (HashBucket *)0x0) {
        pHVar8 = pHVar7;
      }
    }
    else {
      if (uVar1 == 0) {
        if (pHVar8 != (HashBucket *)0x0) {
          this_00->erasedCount = this_00->erasedCount - 1;
          pHVar7 = pHVar8;
        }
        *pHVar7 = (HashBucket)(((ulong)(uVar4 != 0) | (long)params << 0x20) + 0x200000000);
        *(undefined1 *)this = 0;
        goto LAB_00178947;
      }
      if (pHVar7->hash == (uint)(uVar4 != 0)) {
        bVar3 = ArrayPtr<const_unsigned_char>::operator==
                          ((ArrayPtr<const_unsigned_char> *)
                           ((ulong)(uVar1 - 2) * 0x10 + table.size_),in_R9);
        aVar6 = extraout_RDX_00;
        if (bVar3) {
          uVar4 = pHVar7->value;
          *(undefined1 *)this = 1;
          this->erasedCount = (ulong)(uVar4 - 2);
LAB_00178947:
          MVar10.ptr.field_1.value = aVar6.value;
          MVar10.ptr._0_8_ = this;
          return (Maybe<unsigned_long>)MVar10.ptr;
        }
      }
    }
    sVar9 = (ulong)uVar5 + 1;
    uVar5 = 0;
    if (sVar9 != (this_00->buckets).size_) {
      uVar5 = (uint)sVar9;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash.
      rehash(kj::max(buckets.size() * 2, (table.size() + 1) * 2));
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_MAYBE(s, erasedSlot) {
          --erasedCount;
          *s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return nullptr;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == nullptr) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }